

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O0

void __thiscall
duckdb::TopNGlobalSinkState::TopNGlobalSinkState
          (TopNGlobalSinkState *this,ClientContext *context,PhysicalTopN *op)

{
  vector<duckdb::BoundOrderByNode,_true> *in_RDX;
  vector<duckdb::LogicalType,_true> *in_RSI;
  ClientContext *in_RDI;
  TopNHeap *unaff_retaddr;
  PhysicalTopN *in_stack_00000038;
  TopNBoundaryValue *in_stack_00000040;
  GlobalSinkState *in_stack_ffffffffffffffd0;
  idx_t in_stack_ffffffffffffffd8;
  idx_t in_stack_ffffffffffffffe0;
  ClientContext *context_00;
  
  context_00 = in_RDI;
  GlobalSinkState::GlobalSinkState(in_stack_ffffffffffffffd0);
  (in_RDI->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__TopNGlobalSinkState_0352e878;
  ::std::mutex::mutex((mutex *)0x185a4bc);
  TopNHeap::TopNHeap(unaff_retaddr,context_00,in_RSI,in_RDX,in_stack_ffffffffffffffe0,
                     in_stack_ffffffffffffffd8);
  TopNBoundaryValue::TopNBoundaryValue(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

TopNGlobalSinkState(ClientContext &context, const PhysicalTopN &op)
	    : heap(context, op.types, op.orders, op.limit, op.offset), boundary_value(op) {
	}